

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::updateFtranBFRT(HEkkDual *this)

{
  HighsSimplexAnalysis *in_RDI;
  HVector *in_stack_00000008;
  double local_col_BFRT_density;
  bool time_updateFtranBFRT;
  undefined4 in_stack_ffffffffffffffd8;
  HighsInt in_stack_ffffffffffffffdc;
  HVector *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  byte bVar1;
  
  if (*(int *)&(in_RDI->log_options).user_callback_active == 0) {
    bVar1 = 0 < *(int *)&(in_RDI->cleanup_dual_change_distribution).field_0x94;
    if ((bool)bVar1) {
      HighsSimplexAnalysis::simplexTimerStart
                ((HighsSimplexAnalysis *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                 (HighsInt)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                 (HighsInt)in_stack_ffffffffffffffe8);
    }
    HEkkDualRow::updateFlip((HEkkDualRow *)local_col_BFRT_density,in_stack_00000008);
    if (*(int *)((long)&(in_RDI->ftran_upper_sparse_density).distribution_name_._M_string_length + 4
                ) != 0) {
      if ((*(byte *)(*(long *)&(((vector<char,_std::allocator<char>_> *)&in_RDI->numRow)->
                               super__Vector_base<char,_std::allocator<char>_>)._M_impl + 0xf1) & 1)
          != 0) {
        HighsSimplexAnalysis::operationRecordBefore
                  ((HighsSimplexAnalysis *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                   (HighsInt)((ulong)in_stack_ffffffffffffffe8 >> 0x20),(HVector *)in_RDI,
                   (double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      }
      HSimplexNla::ftran((HSimplexNla *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                         in_stack_ffffffffffffffe8,(double)in_RDI,
                         (HighsTimerClock *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if ((*(byte *)(*(long *)&in_RDI->numRow + 0xf1) & 1) != 0) {
        HighsSimplexAnalysis::operationRecordAfter
                  (in_RDI,in_stack_ffffffffffffffdc,(HVector *)0x789b02);
      }
    }
    if ((bVar1 & 1) != 0) {
      HighsSimplexAnalysis::simplexTimerStop
                ((HighsSimplexAnalysis *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                 (HighsInt)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                 (HighsInt)in_stack_ffffffffffffffe8);
    }
    HEkk::updateOperationResultDensity
              ((HEkk *)(in_RDI->thread_simplex_clocks).
                       super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl
                       .super__Vector_impl_data._M_finish,
               (double)*(int *)((long)&(in_RDI->ftran_upper_sparse_density).distribution_name_.
                                       _M_string_length + 4) *
               (double)(in_RDI->thread_factor_clocks).
                       super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl
                       .super__Vector_impl_data._M_finish,
               (double *)
               &(in_RDI->thread_simplex_clocks).
                super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
                super__Vector_impl_data._M_finish[0x143].clock_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  }
  return;
}

Assistant:

void HEkkDual::updateFtranBFRT() {
  // Compute the RHS changes corresponding to the BFRT (FTRAN-BFRT)
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;

  // Only time updateFtranBFRT if dualRow.workCount > 0;
  // If dualRow.workCount = 0 then dualRow.updateFlip(&col_BFRT)
  // merely clears col_BFRT so no FTRAN is performed
  bool time_updateFtranBFRT = dualRow.workCount > 0;

  if (time_updateFtranBFRT) {
    analysis->simplexTimerStart(FtranBfrtClock);
  }

  //  debugUpdatedObjectiveValue(ekk_instance_, algorithm, solve_phase, "Before
  //  update_flip");
  dualRow.updateFlip(&col_BFRT);
  //  debugUpdatedObjectiveValue(ekk_instance_, algorithm, solve_phase, "After
  //  update_flip");

  if (col_BFRT.count) {
    if (analysis->analyse_simplex_summary_data)
      analysis->operationRecordBefore(kSimplexNlaFtranBfrt, col_BFRT,
                                      ekk_instance_.info_.col_BFRT_density);
    simplex_nla->ftran(col_BFRT, ekk_instance_.info_.col_BFRT_density,
                       analysis->pointer_serial_factor_clocks);
    if (analysis->analyse_simplex_summary_data)
      analysis->operationRecordAfter(kSimplexNlaFtranBfrt, col_BFRT);
  }
  if (time_updateFtranBFRT) {
    analysis->simplexTimerStop(FtranBfrtClock);
  }
  const double local_col_BFRT_density =
      (double)col_BFRT.count * inv_solver_num_row;
  ekk_instance_.updateOperationResultDensity(
      local_col_BFRT_density, ekk_instance_.info_.col_BFRT_density);
}